

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::OptionDetails::OptionDetails(OptionDetails *this,OptionDetails *rhs)

{
  string *__r;
  element_type *peVar1;
  long in_RSI;
  string *in_RDI;
  string *this_00;
  undefined1 local_30 [32];
  long local_10;
  
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40,(string *)(local_10 + 0x40));
  __r = this_00 + 0x60;
  peVar1 = std::__shared_ptr_access<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12a251);
  (*peVar1->_vptr_Value[2])(local_30);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<const_cxxopts::Value> *)this_00,(shared_ptr<cxxopts::Value> *)__r);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x12a27c);
  *(undefined4 *)(this_00 + 0x70) = *(undefined4 *)(local_10 + 0x70);
  *(undefined8 *)(this_00 + 0x78) = 0;
  return;
}

Assistant:

OptionDetails(const OptionDetails& rhs)
    : m_desc(rhs.m_desc)
    , m_value(rhs.m_value->clone())
    , m_count(rhs.m_count)
    {
    }